

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

void __thiscall pybind11::buffer_info::~buffer_info(buffer_info *this)

{
  buffer_info *this_local;
  
  if ((*(long *)(this + 0x78) != 0) && (((byte)this[0x80] & 1) != 0)) {
    PyBuffer_Release(*(undefined8 *)(this + 0x78));
    if (*(void **)(this + 0x78) != (void *)0x0) {
      operator_delete(*(void **)(this + 0x78),0x50);
    }
  }
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)(this + 0x58));
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)(this + 0x40));
  std::__cxx11::string::~string((string *)(this + 0x18));
  return;
}

Assistant:

~buffer_info() {
        if (m_view && ownview) {
            PyBuffer_Release(m_view);
            delete m_view;
        }
    }